

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O1

string * __thiscall
duckdb::ParquetKeys::GetObjectType_abi_cxx11_(string *__return_storage_ptr__,ParquetKeys *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x5f74657571726170;
  *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 8) = 0x7379656b;
  __return_storage_ptr__->_M_string_length = 0xc;
  (__return_storage_ptr__->field_2)._M_local_buf[0xc] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string ParquetKeys::GetObjectType() {
	return ObjectType();
}